

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O2

void convolve_2d_sr_ver_2tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  ulong stride;
  long lVar6;
  int16_t *piVar7;
  int16_t *extraout_RDX;
  uint8_t *dst_00;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  __m256i alVar16;
  undefined1 auVar17 [16];
  __m128i res;
  __m256i coeffs_256;
  __m256i r [2];
  __m256i local_2a0;
  undefined4 local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  __m256i local_260;
  undefined1 local_240 [32];
  __m256i local_220;
  undefined1 local_200 [32];
  longlong local_1e0;
  longlong lStack_1d8;
  longlong lStack_1d0;
  longlong lStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  longlong local_1a0;
  longlong lStack_198;
  longlong lStack_190;
  longlong lStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  longlong local_160 [8];
  longlong local_120 [8];
  longlong local_e0 [8];
  longlong local_a0 [14];
  
  if (w < 5) {
    piVar7 = filter_params_y->filter_ptr;
    uVar1 = *(undefined4 *)
             (piVar7 + (ulong)((uint)filter_params_y->taps * (subpel_y_q4 & 0xfU)) + 3);
    auVar17._4_4_ = uVar1;
    auVar17._0_4_ = uVar1;
    auVar17._8_4_ = uVar1;
    auVar17._12_4_ = uVar1;
    stride = (ulong)(uint)(dst_stride * 2);
    if (w == 2) {
      uVar3 = *(uint *)im_block;
      lVar6 = 0;
      auVar13._8_4_ = 0x400;
      auVar13._0_8_ = 0x40000000400;
      auVar13._12_4_ = 0x400;
      do {
        auVar14 = vpinsrd_avx(ZEXT416(uVar3),*(undefined4 *)(im_block + lVar6 * 2 + 2),1);
        uVar3 = *(uint *)(im_block + lVar6 * 2 + 4);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *(ulong *)(im_block + lVar6 * 2 + 2);
        auVar14 = vpunpcklwd_avx(auVar14,auVar10);
        auVar14 = vpmaddwd_avx(auVar14,auVar17);
        auVar14 = vpaddd_avx(auVar14,auVar13);
        auVar14 = vpsrad_avx(auVar14,0xb);
        auVar14 = vpackssdw_avx(auVar14,auVar14);
        auVar14 = vpackuswb_avx(auVar14,auVar14);
        vpextrw_avx(auVar14,0);
        vpextrw_avx(auVar14,1);
        lVar6 = lVar6 + 2;
      } while (h != (int)lVar6);
    }
    else {
      auVar12 = ZEXT864(*(ulong *)im_block);
      lVar6 = 0;
      local_270 = 0x400;
      uStack_26c = 0x400;
      uStack_268 = 0x400;
      uStack_264 = 0x400;
      do {
        auVar13 = *(undefined1 (*) [16])(im_block + lVar6 * 4 + 4);
        auVar14._8_8_ = auVar13._0_8_;
        auVar14._0_8_ = auVar13._0_8_;
        auVar15 = vpsrldq_avx(auVar13,8);
        auVar4 = vpunpcklwd_avx(auVar12._0_16_,auVar13);
        auVar14 = vpunpckhwd_avx(auVar14,auVar13);
        auVar13 = vpmaddwd_avx(auVar4,auVar17);
        auVar14 = vpmaddwd_avx(auVar14,auVar17);
        auVar4._4_4_ = uStack_26c;
        auVar4._0_4_ = local_270;
        auVar4._8_4_ = uStack_268;
        auVar4._12_4_ = uStack_264;
        auVar13 = vpaddd_avx(auVar13,auVar4);
        auVar10 = vpsrad_avx(auVar13,0xb);
        auVar13 = vpaddd_avx(auVar14,auVar4);
        auVar13 = vpsrad_avx(auVar13,0xb);
        vpackssdw_avx(auVar10,auVar13);
        res[1] = (long)dst_stride;
        res[0] = (longlong)dst;
        pack_store_4x2_sse2(res,(uint8_t *)piVar7,stride);
        dst = dst + dst_stride * 2;
        lVar6 = lVar6 + 2;
        auVar12 = ZEXT1664(auVar15);
        piVar7 = extraout_RDX;
      } while (h != (int)lVar6);
    }
  }
  else {
    uVar1 = *(undefined4 *)
             (filter_params_y->filter_ptr +
             (ulong)((uint)filter_params_y->taps * (subpel_y_q4 & 0xfU)) + 3);
    alVar16[0]._4_4_ = uVar1;
    alVar16[0]._0_4_ = uVar1;
    alVar16[1]._0_4_ = uVar1;
    alVar16[1]._4_4_ = uVar1;
    alVar16[2]._0_4_ = uVar1;
    alVar16[2]._4_4_ = uVar1;
    alVar16[3]._0_4_ = uVar1;
    alVar16[3]._4_4_ = uVar1;
    local_2a0 = alVar16;
    switch(w << 0x1d | w - 8U >> 3) {
    case 0:
      auVar17 = *(undefined1 (*) [16])im_block;
      pauVar8 = (undefined1 (*) [16])(im_block + 0x10);
      do {
        auVar11._0_16_ = ZEXT116(0) * pauVar8[-1] + ZEXT116(1) * auVar17;
        auVar11._16_16_ = ZEXT116(1) * pauVar8[-1];
        auVar17 = *pauVar8;
        auVar2 = vpunpcklwd_avx2(auVar11,*(undefined1 (*) [32])(pauVar8 + -1));
        auVar11 = vpunpckhwd_avx2(auVar11,*(undefined1 (*) [32])(pauVar8 + -1));
        local_260 = (__m256i)vpmaddwd_avx2(auVar2,(undefined1  [32])alVar16);
        local_240 = vpmaddwd_avx2(auVar11,(undefined1  [32])alVar16);
        xy_y_round_store_8x2_avx2(&local_260,dst,(long)dst_stride);
        dst = dst + dst_stride * 2;
        pauVar8 = pauVar8 + 2;
        h = h + -2;
      } while (h != 0);
      break;
    case 1:
      auVar11 = *(undefined1 (*) [32])im_block;
      pauVar9 = (undefined1 (*) [32])(im_block + 0x20);
      do {
        auVar2 = pauVar9[-1];
        auVar5 = vpunpcklwd_avx2(auVar11,auVar2);
        auVar11 = vpunpckhwd_avx2(auVar11,auVar2);
        local_260 = (__m256i)vpmaddwd_avx2(auVar5,(undefined1  [32])alVar16);
        local_240 = vpmaddwd_avx2(auVar11,(undefined1  [32])alVar16);
        auVar11 = *pauVar9;
        auVar5 = vpunpcklwd_avx2(auVar2,auVar11);
        auVar2 = vpunpckhwd_avx2(auVar2,auVar11);
        local_220 = (__m256i)vpmaddwd_avx2(auVar5,(undefined1  [32])alVar16);
        local_200 = vpmaddwd_avx2(auVar2,(undefined1  [32])alVar16);
        xy_y_round_store_16x2_avx2(&local_260,dst,(long)dst_stride);
        dst = dst + dst_stride * 2;
        pauVar9 = pauVar9 + 2;
        h = h + -2;
      } while (h != 0);
      break;
    default:
      local_260 = *(__m256i *)im_block;
      local_240 = *(undefined1 (*) [32])(im_block + 0x10);
      local_220 = *(__m256i *)(im_block + 0x20);
      local_200 = *(undefined1 (*) [32])(im_block + 0x30);
      local_1e0 = *(longlong *)(im_block + 0x40);
      lStack_1d8 = *(longlong *)(im_block + 0x44);
      lStack_1d0 = *(longlong *)(im_block + 0x48);
      lStack_1c8 = *(longlong *)(im_block + 0x4c);
      local_1c0 = *(undefined8 *)(im_block + 0x50);
      uStack_1b8 = *(undefined8 *)(im_block + 0x54);
      uStack_1b0 = *(undefined8 *)(im_block + 0x58);
      uStack_1a8 = *(undefined8 *)(im_block + 0x5c);
      local_1a0 = *(longlong *)(im_block + 0x60);
      lStack_198 = *(longlong *)(im_block + 100);
      lStack_190 = *(longlong *)(im_block + 0x68);
      lStack_188 = *(longlong *)(im_block + 0x6c);
      local_180 = *(undefined8 *)(im_block + 0x70);
      uStack_178 = *(undefined8 *)(im_block + 0x74);
      uStack_170 = *(undefined8 *)(im_block + 0x78);
      uStack_168 = *(undefined8 *)(im_block + 0x7c);
      lVar6 = (long)dst_stride;
      piVar7 = im_block + 0x160;
      do {
        xy_y_convolve_2tap_32_all_avx2
                  (piVar7 + -0xe0,&local_260,(__m256i *)local_160,&local_2a0,dst);
        xy_y_convolve_2tap_32_all_avx2
                  (piVar7 + -0xc0,&local_220,(__m256i *)local_120,&local_2a0,dst + 0x20);
        xy_y_convolve_2tap_32_all_avx2
                  (piVar7 + -0xa0,(__m256i *)&local_1e0,(__m256i *)local_e0,&local_2a0,dst + 0x40);
        xy_y_convolve_2tap_32_all_avx2
                  (piVar7 + -0x80,(__m256i *)&local_1a0,(__m256i *)local_a0,&local_2a0,dst + 0x60);
        xy_y_convolve_2tap_32_all_avx2
                  (piVar7 + -0x60,(__m256i *)local_160,&local_260,&local_2a0,dst + lVar6);
        xy_y_convolve_2tap_32_all_avx2
                  (piVar7 + -0x40,(__m256i *)local_120,&local_220,&local_2a0,dst + lVar6 + 0x20);
        xy_y_convolve_2tap_32_all_avx2
                  (piVar7 + -0x20,(__m256i *)local_e0,(__m256i *)&local_1e0,&local_2a0,
                   dst + lVar6 + 0x40);
        xy_y_convolve_2tap_32_all_avx2
                  (piVar7,(__m256i *)local_a0,(__m256i *)&local_1a0,&local_2a0,dst + lVar6 + 0x60);
        dst = dst + dst_stride * 2;
        piVar7 = piVar7 + 0x100;
        h = h + -2;
      } while (h != 0);
      break;
    case 3:
      local_260 = *(__m256i *)im_block;
      local_240 = *(undefined1 (*) [32])(im_block + 0x10);
      piVar7 = im_block + 0x40;
      do {
        xy_y_convolve_2tap_32_all_avx2(piVar7 + -0x20,&local_260,&local_220,&local_2a0,dst);
        xy_y_convolve_2tap_32_all_avx2(piVar7,&local_220,&local_260,&local_2a0,dst + dst_stride);
        dst = dst + dst_stride * 2;
        piVar7 = piVar7 + 0x40;
        h = h + -2;
      } while (h != 0);
      break;
    case 7:
      local_260 = *(__m256i *)im_block;
      local_240 = *(undefined1 (*) [32])(im_block + 0x10);
      local_220 = *(__m256i *)(im_block + 0x20);
      local_200 = *(undefined1 (*) [32])(im_block + 0x30);
      piVar7 = im_block + 0xa0;
      dst_00 = dst + dst_stride;
      do {
        xy_y_convolve_2tap_32_all_avx2
                  (piVar7 + -0x60,&local_260,(__m256i *)&local_1e0,&local_2a0,dst);
        xy_y_convolve_2tap_32_all_avx2
                  (piVar7 + -0x40,&local_220,(__m256i *)&local_1a0,&local_2a0,dst + 0x20);
        xy_y_convolve_2tap_32_all_avx2
                  (piVar7 + -0x20,(__m256i *)&local_1e0,&local_260,&local_2a0,dst_00);
        xy_y_convolve_2tap_32_all_avx2
                  (piVar7,(__m256i *)&local_1a0,&local_220,&local_2a0,dst_00 + 0x20);
        dst = dst + dst_stride * 2;
        piVar7 = piVar7 + 0x80;
        dst_00 = dst_00 + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_2tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y = h;

  if (w <= 4) {
    __m128i coeffs_128;

    prepare_coeffs_2tap_sse2(filter_params_y, subpel_y_q4, &coeffs_128);

    if (w == 2) {
      __m128i s_32[2];

      s_32[0] = _mm_cvtsi32_si128(*(int32_t *)im);

      do {
        const __m128i res = xy_y_convolve_2tap_2x2_sse2(im, s_32, &coeffs_128);
        xy_y_round_store_2x2_sse2(res, dst, dst_stride);
        im += 2 * 2;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else {
      __m128i s_64[2], r[2];

      assert(w == 4);

      s_64[0] = _mm_loadl_epi64((__m128i *)im);

      do {
        xy_y_convolve_2tap_4x2_sse2(im, s_64, &coeffs_128, r);
        r[0] = xy_y_round_sse2(r[0]);
        r[1] = xy_y_round_sse2(r[1]);
        const __m128i rr = _mm_packs_epi32(r[0], r[1]);
        pack_store_4x2_sse2(rr, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    }
  } else {
    __m256i coeffs_256;

    prepare_coeffs_2tap_avx2(filter_params_y, subpel_y_q4, &coeffs_256);

    if (w == 8) {
      __m128i s_128[2];
      __m256i r[2];

      s_128[0] = _mm_loadu_si128((__m128i *)im);

      do {
        xy_y_convolve_2tap_8x2_avx2(im, s_128, &coeffs_256, r);
        xy_y_round_store_8x2_avx2(r, dst, dst_stride);
        im += 2 * 8;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 16) {
      __m256i s_256[2], r[4];

      s_256[0] = _mm256_loadu_si256((__m256i *)im);

      do {
        xy_y_convolve_2tap_16x2_avx2(im, s_256, &coeffs_256, r);
        xy_y_round_store_16x2_avx2(r, dst, dst_stride);
        im += 2 * 16;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 32) {
      __m256i s_256[2][2];

      s_256[0][0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
      s_256[0][1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));

      do {
        xy_y_convolve_2tap_32_all_avx2(im + 32, s_256[0], s_256[1], &coeffs_256,
                                       dst);
        im += 2 * 32;
        xy_y_convolve_2tap_32_all_avx2(im, s_256[1], s_256[0], &coeffs_256,
                                       dst + dst_stride);
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 64) {
      __m256i s_256[2][4];

      s_256[0][0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
      s_256[0][1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));
      s_256[0][2] = _mm256_loadu_si256((__m256i *)(im + 2 * 16));
      s_256[0][3] = _mm256_loadu_si256((__m256i *)(im + 3 * 16));

      do {
        xy_y_convolve_2tap_32_all_avx2(im + 64, s_256[0] + 0, s_256[1] + 0,
                                       &coeffs_256, dst);
        xy_y_convolve_2tap_32_all_avx2(im + 96, s_256[0] + 2, s_256[1] + 2,
                                       &coeffs_256, dst + 32);
        im += 2 * 64;
        xy_y_convolve_2tap_32_all_avx2(im, s_256[1] + 0, s_256[0] + 0,
                                       &coeffs_256, dst + dst_stride);
        xy_y_convolve_2tap_32_all_avx2(im + 32, s_256[1] + 2, s_256[0] + 2,
                                       &coeffs_256, dst + dst_stride + 32);
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else {
      __m256i s_256[2][8];

      assert(w == 128);

      load_16bit_8rows_avx2(im, 16, s_256[0]);

      do {
        xy_y_convolve_2tap_32_all_avx2(im + 128, s_256[0] + 0, s_256[1] + 0,
                                       &coeffs_256, dst);
        xy_y_convolve_2tap_32_all_avx2(im + 160, s_256[0] + 2, s_256[1] + 2,
                                       &coeffs_256, dst + 1 * 32);
        xy_y_convolve_2tap_32_all_avx2(im + 192, s_256[0] + 4, s_256[1] + 4,
                                       &coeffs_256, dst + 2 * 32);
        xy_y_convolve_2tap_32_all_avx2(im + 224, s_256[0] + 6, s_256[1] + 6,
                                       &coeffs_256, dst + 3 * 32);
        im += 2 * 128;
        xy_y_convolve_2tap_32_all_avx2(im, s_256[1] + 0, s_256[0] + 0,
                                       &coeffs_256, dst + dst_stride);
        xy_y_convolve_2tap_32_all_avx2(im + 32, s_256[1] + 2, s_256[0] + 2,
                                       &coeffs_256, dst + dst_stride + 1 * 32);
        xy_y_convolve_2tap_32_all_avx2(im + 64, s_256[1] + 4, s_256[0] + 4,
                                       &coeffs_256, dst + dst_stride + 2 * 32);
        xy_y_convolve_2tap_32_all_avx2(im + 96, s_256[1] + 6, s_256[0] + 6,
                                       &coeffs_256, dst + dst_stride + 3 * 32);
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    }
  }
}